

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

string_t duckdb::UnaryLambdaWrapperWithNulls::
         Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                   (date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  StrfTimeFormat *this;
  Vector *pVVar1;
  ulong uVar2;
  char *target;
  idx_t len;
  anon_union_16_2_67f50693_for_value aVar3;
  undefined1 local_48 [16];
  string local_38;
  
  local_48._8_8_ = local_48._0_8_;
  if ((input.days == -0x7fffffff) || (input.days == 0x7fffffff)) {
    pVVar1 = (Vector *)
             (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    Date::ToString_abi_cxx11_(&local_38,(Date *)(ulong)(uint)input.days,(date_t)(int32_t)idx);
    aVar3.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(pVVar1,&local_38)
    ;
    local_48._0_8_ = aVar3._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
      aVar3.pointer.ptr = (char *)aVar3._8_8_;
      aVar3._0_8_ = local_48._0_8_;
    }
  }
  else {
    this = (StrfTimeFormat *)(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    pVVar1 = (Vector *)StrfTimeFormat::GetLength(this,input,(dtime_t)0x0,0,(char *)0x0);
    local_48 = (undefined1  [16])
               StringVector::EmptyString
                         ((StringVector *)
                          (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,pVVar1,len);
    target = local_48._8_8_;
    if (local_48._0_4_ < 0xd) {
      target = local_48 + 4;
    }
    StrfTimeFormat::FormatString(this,input,(dtime_t)0x0,target);
    uVar2 = (ulong)(uint)local_48._0_4_;
    if (uVar2 < 0xd) {
      switchD_012e3010::default(local_48 + 4 + uVar2,0,0xc - uVar2);
      aVar3 = (anon_union_16_2_67f50693_for_value)local_48;
    }
    else {
      local_48._4_4_ = *(undefined4 *)local_48._8_8_;
      aVar3.pointer.ptr = (char *)local_48._8_8_;
      aVar3._0_8_ = local_48._0_8_;
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar3.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto fun = (FUNC *)dataptr;
		return (*fun)(input, mask, idx);
	}